

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

void Curl_global_host_cache_dtor(void)

{
  if (host_cache_initialized == '\x01') {
    Curl_hash_clean_with_criterium(&hostname_cache,(void *)0x0,hostcache_inuse);
    Curl_hash_clean(&hostname_cache);
    host_cache_initialized = '\0';
  }
  return;
}

Assistant:

void Curl_global_host_cache_dtor(void)
{
  if(host_cache_initialized) {
    /* first make sure that any custom "CURLOPT_RESOLVE" names are
       cleared off */
    Curl_hostcache_clean(NULL, &hostname_cache);
    /* then free the remaining hash completely */
    Curl_hash_clean(&hostname_cache);
    host_cache_initialized = 0;
  }
}